

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeReader.cpp
# Opt level: O3

AuxArray<Js::FuncInfoEntry> *
Js::ByteCodeReader::ReadAuxArray<Js::FuncInfoEntry>(uint offset,FunctionBody *functionBody)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  ByteBlock *pBVar5;
  byte *pbVar6;
  undefined4 *puVar7;
  ulong uVar8;
  
  pBVar5 = (ByteBlock *)FunctionProxy::GetAuxPtr((FunctionProxy *)functionBody,AuxBlock);
  pbVar6 = ByteBlock::GetBuffer(pBVar5);
  uVar8 = (ulong)offset;
  uVar1 = *(uint *)(pbVar6 + uVar8);
  pBVar5 = (ByteBlock *)FunctionProxy::GetAuxPtr((FunctionProxy *)functionBody,AuxBlock);
  uVar4 = ByteBlock::GetLength(pBVar5);
  if ((ulong)uVar4 < uVar8 + (ulong)uVar1 * 8 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeReader.cpp"
                                ,0xe8,
                                "(offset + auxArray->GetDataSize() <= functionBody->GetAuxiliaryData()->GetLength())"
                                ,
                                "offset + auxArray->GetDataSize() <= functionBody->GetAuxiliaryData()->GetLength()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return (AuxArray<Js::FuncInfoEntry> *)(pbVar6 + uVar8);
}

Assistant:

AuxArray<T> const * ByteCodeReader::ReadAuxArray(uint offset, FunctionBody * functionBody)
    {
        Js::AuxArray<T> const * auxArray = (Js::AuxArray<T> const *)(functionBody->GetAuxiliaryData()->GetBuffer() + offset);
        Assert(offset + auxArray->GetDataSize() <= functionBody->GetAuxiliaryData()->GetLength());
        return auxArray;
    }